

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

void cpu_instr_add_hl(gb_cpu_t *cpu,uint16_t value)

{
  gb *pgVar1;
  uint uVar2;
  uint uVar3;
  undefined6 in_register_00000032;
  
  pgVar1 = cpu->gb;
  timer_update(&pgVar1->timer,4);
  ppu_update(&pgVar1->ppu,4);
  uVar3 = (uint)CONCAT62(in_register_00000032,value);
  uVar2 = (cpu->field_3).reg_hl + uVar3;
  (cpu->field_0).field_0.reg_f =
       (0xffff < uVar2) << 4 | (cpu->field_0).field_0.reg_f & 0x8f |
       (0xfff < (uVar3 & 0xfff) + ((cpu->field_3).reg_hl & 0xfff)) << 5;
  (cpu->field_3).reg_hl = (uint16_t)uVar2;
  return;
}

Assistant:

static inline void cpu_instr_add_hl(gb_cpu_t *cpu, uint16_t value)
{
    sync_with_cpu(cpu, 4); // internal

    SET_N(0);
    SET_H(CHECK_CARRY_12((cpu->reg_hl & 0xFFF) + (value & 0xFFF)));
    SET_C(CHECK_CARRY_16(cpu->reg_hl + value));

    cpu->reg_hl += value;
}